

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall Assimp::IFC::Schema_2x3::IfcBooleanResult::~IfcBooleanResult(IfcBooleanResult *this)

{
  undefined1 *puVar1;
  
  this[-1].SecondOperand.
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__IfcBooleanResult_008149b0;
  (this->FirstOperand).
  super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)&PTR__IfcBooleanResult_00814a28;
  *(undefined ***)&this[-1].field_0x78 = &PTR__IfcBooleanResult_008149d8;
  (this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcBooleanResult_00814a00;
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x48 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x48);
  }
  if (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x38 !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (*(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->field_0x38);
  }
  puVar1 = *(undefined1 **)
            &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10;
  if (puVar1 != &(this->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20)
  {
    operator_delete(puVar1);
  }
  operator_delete(&this[-1].SecondOperand.
                   super___shared_ptr<const_Assimp::STEP::EXPRESS::DataType,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount);
  return;
}

Assistant:

IfcBooleanResult() : Object("IfcBooleanResult") {}